

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O1

int secp256k1_scalar_cond_negate(secp256k1_scalar *r,int flag)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  ulong uVar8;
  ulong uVar9;
  uint64_t uVar10;
  ulong uVar11;
  long lVar12;
  undefined4 unaff_R15D;
  int iVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  int vflag;
  
  lVar12 = (long)flag;
  secp256k1_scalar_verify(r);
  auVar15._0_4_ = -(uint)((int)r->d[2] == 0 && (int)r->d[0] == 0);
  auVar15._4_4_ = -(uint)(*(int *)((long)r->d + 0x14) == 0 && *(int *)((long)r->d + 4) == 0);
  auVar15._8_4_ = -(uint)((int)r->d[3] == 0 && (int)r->d[1] == 0);
  auVar15._12_4_ = -(uint)(*(int *)((long)r->d + 0x1c) == 0 && *(int *)((long)r->d + 0xc) == 0);
  iVar13 = movmskps(unaff_R15D,auVar15);
  secp256k1_scalar_verify(r);
  uVar7 = 0;
  uVar5 = -lVar12;
  uVar8 = r->d[0] ^ uVar5;
  uVar9 = r->d[1] ^ uVar5;
  uVar11 = r->d[2] ^ uVar5;
  uVar1 = r->d[3];
  uVar2 = (ulong)CARRY8(uVar5 & 0xbfd25e8cd0364142,uVar8);
  uVar3 = (uVar5 & 0xbaaedce6af48a03b) + uVar9;
  uVar9 = (ulong)(CARRY8(uVar5 & 0xbaaedce6af48a03b,uVar9) || CARRY8(uVar3,uVar2));
  uVar4 = (uVar5 & 0xfffffffffffffffe) + uVar11;
  bVar14 = iVar13 == 0xf;
  uVar10 = uVar3 + uVar2;
  uVar6 = (uVar5 & 0xbfd25e8cd0364142) + uVar8;
  if (bVar14) {
    uVar10 = uVar7;
    uVar6 = uVar7;
  }
  r->d[0] = uVar6;
  r->d[1] = uVar10;
  uVar6 = uVar4 + uVar9;
  if (bVar14) {
    uVar6 = uVar7;
  }
  r->d[2] = uVar6;
  uVar6 = ((uVar5 ^ uVar1) - lVar12) +
          (ulong)(CARRY8(uVar5 & 0xfffffffffffffffe,uVar11) || CARRY8(uVar4,uVar9));
  if (bVar14) {
    uVar6 = uVar7;
  }
  r->d[3] = uVar6;
  secp256k1_scalar_verify(r);
  return -(uint)(lVar12 != 0) | 1;
}

Assistant:

static int secp256k1_scalar_cond_negate(secp256k1_scalar *r, int flag) {
    /* If we are flag = 0, mask = 00...00 and this is a no-op;
     * if we are flag = 1, mask = 11...11 and this is identical to secp256k1_scalar_negate */
    volatile int vflag = flag;
    uint64_t mask = -vflag;
    uint64_t nonzero = (secp256k1_scalar_is_zero(r) != 0) - 1;
    secp256k1_uint128 t;
    SECP256K1_SCALAR_VERIFY(r);

    secp256k1_u128_from_u64(&t, r->d[0] ^ mask);
    secp256k1_u128_accum_u64(&t, (SECP256K1_N_0 + 1) & mask);
    r->d[0] = secp256k1_u128_to_u64(&t) & nonzero; secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[1] ^ mask);
    secp256k1_u128_accum_u64(&t, SECP256K1_N_1 & mask);
    r->d[1] = secp256k1_u128_to_u64(&t) & nonzero; secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[2] ^ mask);
    secp256k1_u128_accum_u64(&t, SECP256K1_N_2 & mask);
    r->d[2] = secp256k1_u128_to_u64(&t) & nonzero; secp256k1_u128_rshift(&t, 64);
    secp256k1_u128_accum_u64(&t, r->d[3] ^ mask);
    secp256k1_u128_accum_u64(&t, SECP256K1_N_3 & mask);
    r->d[3] = secp256k1_u128_to_u64(&t) & nonzero;

    SECP256K1_SCALAR_VERIFY(r);
    return 2 * (mask == 0) - 1;
}